

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collada.cpp
# Opt level: O0

void CMU462::Collada::writeCurrentTime(ofstream *out)

{
  tm *__src;
  ostream *poVar1;
  ostream *in_RDI;
  tm tm;
  time_t t;
  int local_48;
  int local_44;
  int local_40;
  int local_3c;
  int local_38;
  int local_34;
  time_t local_10;
  ostream *local_8;
  
  local_8 = in_RDI;
  local_10 = ::time((time_t *)0x0);
  __src = localtime(&local_10);
  memcpy(&local_48,__src,0x38);
  poVar1 = (ostream *)std::ostream::operator<<(local_8,local_34 + 0x76c);
  std::operator<<(poVar1,"-");
  if (local_38 < 10) {
    std::operator<<(local_8,"0");
  }
  poVar1 = (ostream *)std::ostream::operator<<(local_8,local_38 + 1);
  std::operator<<(poVar1,"-");
  if (local_3c < 10) {
    std::operator<<(local_8,"0");
  }
  poVar1 = (ostream *)std::ostream::operator<<(local_8,local_3c);
  std::operator<<(poVar1,"T");
  if (local_40 < 10) {
    std::operator<<(local_8,"0");
  }
  poVar1 = (ostream *)std::ostream::operator<<(local_8,local_40);
  std::operator<<(poVar1,":");
  if (local_44 < 10) {
    std::operator<<(local_8,"0");
  }
  poVar1 = (ostream *)std::ostream::operator<<(local_8,local_44);
  std::operator<<(poVar1,":");
  if (local_48 < 10) {
    std::operator<<(local_8,"0");
  }
  std::ostream::operator<<(local_8,local_48);
  return;
}

Assistant:

void writeCurrentTime(ofstream& out) {
  auto t = time(nullptr);
  auto tm = *localtime(&t);

  out << tm.tm_year + 1900 << "-";
  if (tm.tm_mon < 10) out << "0";
  out << tm.tm_mon + 1 << "-";
  if (tm.tm_mday < 10) out << "0";
  out << tm.tm_mday << "T";
  if (tm.tm_hour < 10) out << "0";
  out << tm.tm_hour << ":";
  if (tm.tm_min < 10) out << "0";
  out << tm.tm_min << ":";
  if (tm.tm_sec < 10) out << "0";
  out << tm.tm_sec;
}